

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QLoggingRule>::reallocate
          (QMovableArrayOps<QLoggingRule> *this,qsizetype alloc,AllocationOption option)

{
  long lVar1;
  AllocationOption in_EDX;
  qsizetype in_RSI;
  QLoggingRule *in_RDI;
  long in_FS_OFFSET;
  pair<QTypedArrayData<QLoggingRule>_*,_QLoggingRule_*> pVar2;
  pair<QTypedArrayData<QLoggingRule>_*,_QLoggingRule_*> pair;
  QLoggingRule *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar2 = QTypedArrayData<QLoggingRule>::reallocateUnaligned
                    ((QTypedArrayData<QLoggingRule> *)&DAT_aaaaaaaaaaaaaaaa,in_RDI,in_RSI,in_EDX);
  local_10 = pVar2.second;
  if (local_10 == (QLoggingRule *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      qBadAlloc();
    }
  }
  else {
    (in_RDI->category).d.d = (Data *)pVar2.first;
    (in_RDI->category).d.ptr = (char16_t *)local_10;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }